

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O2

int4 PrintLanguage::getCodepoint(uint1 *buf,int4 charsize,bool bigend,int4 *skip)

{
  uint uVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  int4 iVar5;
  
  if (charsize == 1) {
    uVar2 = (uint)*buf;
    if ((char)*buf < '\0') {
      if ((uVar2 & 0xffffffe0) == 0xc0) {
        if ((buf[1] & 0xffffffc0) != 0x80) {
          return -1;
        }
        uVar2 = buf[1] & 0x3f | (uVar2 & 0x1f) << 6;
        iVar5 = 2;
      }
      else if ((uVar2 & 0xfffffff0) == 0xe0) {
        if ((buf[2] & 0xffffffc0) != 0x80 || (buf[1] & 0xc0) != 0x80) {
          return -1;
        }
        uVar2 = buf[2] & 0x3f | (buf[1] & 0x3f) << 6 | (uVar2 & 0xf) << 0xc;
        iVar5 = 3;
      }
      else {
        if ((uVar2 & 0xfffffff8) != 0xf0) {
          return -1;
        }
        if ((buf[3] & 0xffffffc0) != 0x80 ||
            ((buf[2] & 0xffffffc0) != 0x80 || (buf[1] & 0xc0) != 0x80)) {
          return -1;
        }
        uVar2 = buf[3] & 0x3f | (buf[2] & 0x3f) << 6 | (buf[1] & 0x3f) << 0xc | (uVar2 & 7) << 0x12;
        iVar5 = 4;
      }
    }
    else {
      iVar5 = 1;
    }
    goto LAB_00324dd3;
  }
  if (charsize == 4) {
    if (bigend) {
      uVar2 = *(uint *)buf;
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
    else {
      uVar2 = *(uint *)buf;
    }
  }
  else {
    if (charsize != 2) {
      return -1;
    }
    if (bigend) {
      uVar2 = (uint)CONCAT11(*buf,buf[1]);
      uVar1 = *buf & 0xfc;
      uVar4 = uVar1 << 8;
      if (uVar1 != 0xd8) {
LAB_00324de8:
        if (uVar4 == 0xdc00) {
          return -1;
        }
        iVar5 = 2;
        goto LAB_00324dd3;
      }
      uVar3 = *(ushort *)(buf + 2) << 8 | *(ushort *)(buf + 2) >> 8;
    }
    else {
      uVar2 = (uint)*(ushort *)buf;
      uVar4 = uVar2 & 0xfc00;
      if (uVar4 != 0xd800) goto LAB_00324de8;
      uVar3 = *(ushort *)(buf + 2);
    }
    if ((uVar3 & 0xfc00) != 0xdc00) {
      return -1;
    }
    uVar2 = uVar2 * 0x400 + (uint)uVar3 + 0xfca02400;
  }
  iVar5 = 4;
LAB_00324dd3:
  uVar4 = 0xffffffff;
  if ((uVar2 & 0xfffff800) != 0xd800) {
    *skip = iVar5;
    uVar4 = uVar2;
  }
  return uVar4;
}

Assistant:

int4 PrintLanguage::getCodepoint(const uint1 *buf,int4 charsize,bool bigend,int4 &skip)

{
  int4 codepoint;
  int4 sk = 0;
  if (charsize==2) {		// UTF-16
    codepoint = readUtf16(buf,bigend);
    sk += 2;
    if ((codepoint>=0xD800)&&(codepoint<=0xDBFF)) { // high surrogate
      int4 trail=readUtf16(buf+2,bigend);
      sk += 2;
      if ((trail<0xDC00)||(trail>0xDFFF)) return -1; // Bad trail
      codepoint = (codepoint<<10) + trail + (0x10000 - (0xD800 << 10) - 0xDC00);
    }
    else if ((codepoint>=0xDC00)&&(codepoint<=0xDFFF)) return -1; // trail before high
  }
  else if (charsize==1) {	// UTF-8
    int4 val = buf[0];
    if ((val&0x80)==0) {
      codepoint = val;
      sk = 1;
    }
    else if ((val&0xe0)==0xc0) {
      int4 val2 = buf[1];
      sk = 2;
      if ((val2&0xc0)!=0x80) return -1; // Not a valid UTF8-encoding
      codepoint = ((val&0x1f)<<6) | (val2 & 0x3f);
    }
    else if ((val&0xf0)==0xe0) {
      int4 val2 = buf[1];
      int4 val3 = buf[2];
      sk = 3;
      if (((val2&0xc0)!=0x80)||((val3&0xc0)!=0x80)) return -1; // invalid encoding
      codepoint = ((val&0xf)<<12) | ((val2&0x3f)<<6) | (val3 & 0x3f);
    }
    else if ((val&0xf8)==0xf0) {
      int4 val2 = buf[1];
      int4 val3 = buf[2];
      int4 val4 = buf[3];
      sk = 4;
      if (((val2&0xc0)!=0x80)||((val3&0xc0)!=0x80)||((val4&0xc0)!=0x80)) return -1;	// invalid encoding
      codepoint = ((val&7)<<18) | ((val2&0x3f)<<12) | ((val3&0x3f)<<6) | (val4 & 0x3f);
    }
    else
      return -1;
  }
  else if (charsize == 4) {	// UTF-32
    sk = 4;
    if (bigend)
      codepoint = (buf[0]<<24) + (buf[1]<<16) + (buf[2]<<8) + buf[3];
    else
      codepoint = (buf[3]<<24) + (buf[2]<<16) + (buf[1]<<8) + buf[0];
  }
  else
    return -1;
  if (codepoint >= 0xd800 && codepoint <= 0xdfff)
    return -1;		// Reserved for surrogates, invalid codepoints
  skip = sk;
  return codepoint;
}